

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExport.cpp
# Opt level: O3

bool __thiscall
ODDLParser::OpenDDLExport::writeValueType
          (OpenDDLExport *this,ValueType type,size_t numItems,string *statement)

{
  char *pcVar1;
  string typeStr;
  char buffer [256];
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  allocator local_128 [264];
  
  if (type != ddl_types_max) {
    pcVar1 = getTypeToken(type);
    std::__cxx11::string::string((string *)local_148,pcVar1,local_128);
    std::__cxx11::string::_M_append((char *)statement,(ulong)local_148[0]);
    if (1 < numItems) {
      std::__cxx11::string::append((char *)statement);
      memset(local_128,0,0x100);
      sprintf((char *)local_128,"%d",numItems & 0xffffffff);
      std::__cxx11::string::append((char *)statement);
      std::__cxx11::string::append((char *)statement);
    }
    if (local_148[0] != local_138) {
      operator_delete(local_148[0]);
    }
  }
  return type != ddl_types_max;
}

Assistant:

bool OpenDDLExport::writeValueType( Value::ValueType type, size_t numItems, std::string &statement ) {
    if ( Value::ddl_types_max == type) {
        return false;
    }

    const std::string typeStr( getTypeToken( type ) );
    statement += typeStr;
    // if we have an array to write
    if ( numItems > 1 ) {
        statement += "[";
        char buffer[ 256 ];
        ::memset( buffer, '\0', 256 * sizeof( char ) );
        sprintf( buffer, "%d", static_cast<int>( numItems ) );
        statement += buffer;
        statement += "]";
    }

    return true;
}